

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O3

void __thiscall xercesc_4_0::DOMLSParserImpl::error(DOMLSParserImpl *this)

{
  ErrTypes in_ECX;
  XMLCh *in_RDX;
  uint in_ESI;
  XMLCh *in_R8;
  XMLCh *in_R9;
  XMLFileLoc in_stack_00000010;
  XMLFileLoc in_stack_00000018;
  XMLCh *in_stack_ffffffffffffffe8;
  
  error((DOMLSParserImpl *)&this[-1].fWrapNodesAction,in_ESI,in_RDX,in_ECX,in_R8,in_R9,
        in_stack_ffffffffffffffe8,in_stack_00000010,in_stack_00000018);
  return;
}

Assistant:

void DOMLSParserImpl::error( const   unsigned int                code
                            , const XMLCh* const
                            , const XMLErrorReporter::ErrTypes  errType
                            , const XMLCh* const                errorText
                            , const XMLCh* const                systemId
                            , const XMLCh* const
                            , const XMLFileLoc                  lineNum
                            , const XMLFileLoc                  colNum)
{
    if (fErrorHandler) {

        DOMError::ErrorSeverity severity = DOMError::DOM_SEVERITY_ERROR;

        if (errType == XMLErrorReporter::ErrType_Warning)
            severity = DOMError::DOM_SEVERITY_WARNING;
        else if (errType == XMLErrorReporter::ErrType_Fatal)
            severity = DOMError::DOM_SEVERITY_FATAL_ERROR;

        DOMLocatorImpl location(lineNum, colNum, getCurrentNode(), systemId);
        if(getScanner()->getCalculateSrcOfs())
            location.setByteOffset(getScanner()->getSrcOffset());
        DOMErrorImpl domError(severity, errorText, &location);

        // if user return false, we should stop the process, so throw an error
        bool toContinueProcess = true;
        try
        {
            toContinueProcess = fErrorHandler->handleError(domError);
        }
        catch(...)
        {
        }
        if (!toContinueProcess && !getScanner()->getInException())
            throw (XMLErrs::Codes) code;
    }
}